

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

int secp256k1_fe_normalizes_to_zero(secp256k1_fe *r)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  secp256k1_fe_verify(r);
  uVar2 = (r->n[4] >> 0x30) * 0x1000003d1 + r->n[0];
  uVar1 = (uVar2 >> 0x34) + r->n[1];
  uVar3 = (uVar1 >> 0x34) + r->n[2];
  uVar4 = (uVar3 >> 0x34) + r->n[3];
  uVar5 = (uVar4 >> 0x34) + (r->n[4] & 0xffffffffffff);
  return (int)(((uVar2 ^ 0x1000003d0) & uVar1 & uVar3 & uVar4 & (uVar5 ^ 0xf000000000000)) ==
               0xfffffffffffff ||
              ((uVar1 | uVar2 | uVar3 | uVar4) & 0xfffffffffffff) == 0 && uVar5 == 0);
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_normalizes_to_zero(const secp256k1_fe *r) {
    SECP256K1_FE_VERIFY(r);

    return secp256k1_fe_impl_normalizes_to_zero(r);
}